

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nmos.cc
# Opt level: O1

void __thiscall chipemu::implementation::nmos::set_node(nmos *this,uint id,bool high)

{
  pointer puVar1;
  pointer puVar2;
  unsigned_short *puVar3;
  uint uVar4;
  byte bVar5;
  ushort uVar6;
  
  if (id - 1 < (uint)this->desc_nodes_count) {
    puVar1 = (this->nodes).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar2 = (this->node_offsets).
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = id & 0xffff;
    uVar6 = 2;
    bVar5 = (byte)puVar1[puVar2[uVar4]];
    if ((((bVar5 & !high) != 0) || (uVar6 = 1, ((~high | bVar5) & 1) == 0)) &&
       (puVar1[puVar2[uVar4]] = uVar6 | puVar1[puVar2[uVar4]] & 0xfffc,
       (puVar1[puVar2[uVar4]] & 8) == 0)) {
      puVar3 = (this->changed_feeding)._M_current;
      *puVar3 = (unsigned_short)id;
      puVar3 = puVar3 + 1;
      (this->changed_feeding)._M_current = puVar3;
      if (puVar3 == (this->changed_queue).
                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
        (this->changed_feeding)._M_current =
             (this->changed_queue).
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start;
      }
      puVar1[puVar2[uVar4]] = puVar1[puVar2[uVar4]] | 8;
    }
  }
  return;
}

Assistant:

void
nmos::set_node(unsigned id, bool high) noexcept
{
    if (id > 0 and id <= node_count()) {
        uint16_t *node = node_addr(id);

        if ((*node & node_is_pullup) and not high) {
            *node &= ~node_is_pullup;
            *node |= node_is_pulldown;
        }
        else if (high and not (*node & node_is_pullup)) {
            *node |= node_is_pullup;
            *node &= ~node_is_pulldown;
        }
        else return;

        changed_push(id);
    }
}